

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  size_type in_R9;
  UntypedFormatSpecImpl format;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  ulong local_28;
  code *local_20;
  long local_18;
  code *local_10;
  
  local_28 = *(ulong *)(*(long *)this + 0x18) & 0xfffffffffffffffc;
  local_18 = *(long *)(this + 8) + 8;
  local_20 = str_format_internal::FormatArgImpl::Dispatch<std::__cxx11::string>;
  local_10 = str_format_internal::FormatArgImpl::Dispatch<std::__cxx11::string>;
  format.size_ = (size_t)&local_28;
  format.data_ = (void *)0x69;
  args.len_ = in_R9;
  args.ptr_ = (pointer)0x2;
  str_format_internal::FormatPack_abi_cxx11_
            (__return_storage_ptr__,
             (str_format_internal *)
             "The custom JSON name of field \"%s\" (\"%s\") is invalid: JSON names may not start with \'[\' and end with \']\'."
             ,format,args);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}